

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O3

bool __thiscall
AlternativeLoader::altCheckSection(AlternativeLoader *this,string *mode,string *line)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  
  cVar1 = *(line->_M_dataplus)._M_p;
  if (cVar1 == '[') {
    std::__cxx11::string::_M_replace((ulong)mode,0,(char *)mode->_M_string_length,0x12fdde);
    sVar2 = line->_M_string_length;
    if (sVar2 - 3 < 0xfffffffffffffffe) {
      uVar3 = 1;
      do {
        if ((line->_M_dataplus)._M_p[uVar3] != ']') {
          std::__cxx11::string::push_back((char)mode);
          sVar2 = line->_M_string_length;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < sVar2 - 1);
    }
  }
  return cVar1 == '[';
}

Assistant:

void MapLoader::setMapFile(std::string newMapFile) {
    pMapFile = new std::string(std::move(newMapFile));
}